

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O3

void __thiscall cmGlobalGenerator::FinalizeTargetConfiguration(cmGlobalGenerator *this)

{
  pointer puVar1;
  pointer pcVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  pointer pbVar4;
  _Alloc_hider _Var5;
  string *psVar6;
  pointer puVar7;
  pointer pbVar8;
  __node_base *p_Var9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__v;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  init;
  string standardIncludesVar;
  cmList standardIncludesList;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  langs;
  cmBTStringRange noConfigCompileDefinitions;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  standardIncludesSet;
  optional<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmValue>_>_>_>
  perConfigCompileDefinitions;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  pointer local_120;
  undefined8 local_118;
  undefined8 local_110;
  char *local_108;
  undefined8 local_100;
  string local_f8;
  cmList local_d8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c0;
  cmBTStringRange local_a8;
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  local_98 [8];
  undefined4 local_90 [2];
  undefined8 local_88;
  _Base_ptr local_80;
  _Base_ptr local_78;
  undefined8 local_70;
  optional<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmValue>_>_>_>
  local_68;
  
  cmState::GetEnabledLanguages_abi_cxx11_
            (&local_c0,
             (this->CMakeInstance->State)._M_t.
             super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
             super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
             super__Head_base<0UL,_cmState_*,_false>._M_head_impl);
  puVar7 = (this->Makefiles).
           super__Vector_base<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>,_std::allocator<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (this->Makefiles).
           super__Vector_base<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>,_std::allocator<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar7 != puVar1) {
    do {
      local_a8 = cmMakefile::GetCompileDefinitionsEntries_abi_cxx11_
                           ((puVar7->_M_t).
                            super___uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_>._M_t
                            .super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>.
                            super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl);
      local_68.
      super__Optional_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmValue>_>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmValue>_>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmValue>_>_>_>
      ._M_engaged = false;
      p_Var9 = (__node_base *)
               ((long)&(((puVar7->_M_t).
                         super___uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_>._M_t.
                         super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>.
                         super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl)->Targets)._M_h +
               0x10);
      while (pbVar4 = local_c0.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish, p_Var9 = p_Var9->_M_nxt,
            p_Var9 != (__node_base *)0x0) {
        cmTarget::FinalizeTargetConfiguration((cmTarget *)(p_Var9 + 5),&local_a8,&local_68);
      }
      local_90[0] = 0;
      local_88 = 0;
      local_70 = 0;
      local_80 = (_Base_ptr)local_90;
      local_78 = (_Base_ptr)local_90;
      for (pbVar8 = local_c0.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; pbVar8 != pbVar4; pbVar8 = pbVar8 + 1
          ) {
        local_140._M_dataplus._M_p = (pointer)0x6;
        local_140._M_string_length = 0x7f5fd1;
        local_140.field_2._M_allocated_capacity = 0;
        local_120 = (pbVar8->_M_dataplus)._M_p;
        local_140.field_2._8_8_ = pbVar8->_M_string_length;
        local_118 = 0;
        local_110 = 0x1d;
        local_108 = "_STANDARD_INCLUDE_DIRECTORIES";
        local_100 = 0;
        views._M_len = 3;
        views._M_array = (iterator)&local_140;
        cmCatViews(&local_f8,views);
        psVar6 = cmMakefile::GetSafeDefinition
                           ((puVar7->_M_t).
                            super___uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_>._M_t
                            .super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>.
                            super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl,&local_f8);
        pcVar2 = (psVar6->_M_dataplus)._M_p;
        local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_140,pcVar2,pcVar2 + psVar6->_M_string_length);
        init._M_len = 1;
        init._M_array = &local_140;
        cmList::cmList(&local_d8,init);
        __v = local_d8.Values.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
        _Var5._M_p = (pointer)local_98;
        pbVar3 = local_d8.Values.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_140._M_dataplus._M_p != &local_140.field_2) {
          operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
          __v = local_d8.Values.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
          pbVar3 = local_d8.Values.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        }
        for (; local_140._M_dataplus._M_p = _Var5._M_p, __v != pbVar3; __v = __v + 1) {
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::
          _M_insert_unique_<std::__cxx11::string&,std::_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>::_Alloc_node>
                    (local_98,(_Base_ptr)local_90,__v,(_Alloc_node *)&local_140);
          _Var5._M_p = local_140._M_dataplus._M_p;
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_d8.Values);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
          operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
        }
      }
      cmMakefile::AddSystemIncludeDirectories
                ((puVar7->_M_t).super___uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_>.
                 _M_t.super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>.
                 super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl,
                 (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_98);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_98);
      if (local_68.
          super__Optional_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmValue>_>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmValue>_>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmValue>_>_>_>
          ._M_engaged == true) {
        local_68.
        super__Optional_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmValue>_>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmValue>_>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmValue>_>_>_>
        ._M_engaged = false;
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmValue>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmValue>_>_>
        ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmValue>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmValue>_>_>
                     *)&local_68);
      }
      puVar7 = puVar7 + 1;
    } while (puVar7 != puVar1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_c0);
  return;
}

Assistant:

void cmGlobalGenerator::FinalizeTargetConfiguration()
{
  std::vector<std::string> const langs =
    this->CMakeInstance->GetState()->GetEnabledLanguages();

  // Construct per-target generator information.
  for (const auto& mf : this->Makefiles) {
    const cmBTStringRange noConfigCompileDefinitions =
      mf->GetCompileDefinitionsEntries();
    cm::optional<std::map<std::string, cmValue>> perConfigCompileDefinitions;

    for (auto& target : mf->GetTargets()) {
      cmTarget* t = &target.second;
      t->FinalizeTargetConfiguration(noConfigCompileDefinitions,
                                     perConfigCompileDefinitions);
    }

    // The standard include directories for each language
    // should be treated as system include directories.
    std::set<std::string> standardIncludesSet;
    for (std::string const& li : langs) {
      std::string const standardIncludesVar =
        cmStrCat("CMAKE_", li, "_STANDARD_INCLUDE_DIRECTORIES");
      std::string const& standardIncludesStr =
        mf->GetSafeDefinition(standardIncludesVar);
      cmList standardIncludesList{ standardIncludesStr };
      standardIncludesSet.insert(standardIncludesList.begin(),
                                 standardIncludesList.end());
    }
    mf->AddSystemIncludeDirectories(standardIncludesSet);
  }
}